

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

void destroyContextGLX(_GLFWwindow *window)

{
  GLXWindow GVar1;
  GLXContext p_Var2;
  
  GVar1 = (window->context).glx.window;
  if (GVar1 != 0) {
    (*_glfw.glx.DestroyWindow)(_glfw.x11.display,GVar1);
    (window->context).glx.window = 0;
  }
  p_Var2 = (window->context).glx.handle;
  if (p_Var2 != (GLXContext)0x0) {
    (*_glfw.glx.DestroyContext)(_glfw.x11.display,p_Var2);
    (window->context).glx.handle = (GLXContext)0x0;
  }
  return;
}

Assistant:

static void destroyContextGLX(_GLFWwindow* window)
{
    if (window->context.glx.window)
    {
        glXDestroyWindow(_glfw.x11.display, window->context.glx.window);
        window->context.glx.window = None;
    }

    if (window->context.glx.handle)
    {
        glXDestroyContext(_glfw.x11.display, window->context.glx.handle);
        window->context.glx.handle = NULL;
    }
}